

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking_hugeint.cpp
# Opt level: O1

void duckdb::HugeIntPacker::Unpack(uint32_t *in,uhugeint_t *out,bitpacking_width_t width)

{
  uint64_t *puVar1;
  uhugeint_t *puVar2;
  uint *puVar3;
  long lVar4;
  byte bVar5;
  uint uVar7;
  undefined7 in_register_00000011;
  uhugeint_t *puVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint8_t i;
  uint64_t value;
  uhugeint_t uVar12;
  uhugeint_t local_d0;
  uhugeint_t *local_c0;
  long local_b8;
  uint *local_b0;
  uint local_a4;
  ulong local_a0;
  uint local_94;
  uhugeint_t local_90;
  uhugeint_t local_80;
  uhugeint_t *local_70;
  ulong local_68;
  uhugeint_t local_60;
  uhugeint_t local_50;
  uhugeint_t local_40;
  byte bVar6;
  
  local_94 = (uint)CONCAT71(in_register_00000011,width);
  local_c0 = out;
  switch(local_94 << 0x1b | local_94 >> 5) {
  case 0:
    lVar4 = 0;
    do {
      uhugeint_t::uhugeint_t(&local_d0,0);
      puVar1 = (uint64_t *)((long)&local_c0->lower + lVar4);
      *puVar1 = local_d0.lower;
      puVar1[1] = local_d0.upper;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x200);
    break;
  case 1:
    lVar4 = 0;
    do {
      uhugeint_t::uhugeint_t(&local_d0,(ulong)*(uint *)((long)in + lVar4));
      puVar1 = (uint64_t *)((long)&local_c0->lower + lVar4 * 4);
      *puVar1 = local_d0.lower;
      puVar1[1] = local_d0.upper;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x80);
    break;
  case 2:
    lVar4 = 0;
    do {
      uhugeint_t::uhugeint_t(&local_d0,(ulong)in[lVar4 * 2]);
      puVar8 = local_c0;
      local_c0->lower = local_d0.lower;
      local_c0->upper = local_d0.upper;
      uhugeint_t::uhugeint_t(&local_80,(ulong)in[lVar4 * 2 + 1]);
      uhugeint_t::uhugeint_t(&local_90,0x20);
      local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
      uhugeint_t::operator|=(puVar8,&local_d0);
      lVar4 = lVar4 + 1;
      local_c0 = puVar8 + 1;
    } while (lVar4 != 0x20);
    break;
  case 3:
    lVar4 = 8;
    do {
      uhugeint_t::uhugeint_t(&local_d0,(ulong)*(uint *)((long)in + lVar4 + -8));
      puVar8 = local_c0;
      local_c0->lower = local_d0.lower;
      local_c0->upper = local_d0.upper;
      uhugeint_t::uhugeint_t(&local_80,(ulong)*(uint *)((long)in + lVar4 + -4));
      uhugeint_t::uhugeint_t(&local_90,0x20);
      local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
      uhugeint_t::operator|=(puVar8,&local_d0);
      uhugeint_t::uhugeint_t(&local_80,(ulong)*(uint *)((long)in + lVar4));
      uhugeint_t::uhugeint_t(&local_90,0x40);
      local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
      uhugeint_t::operator|=(puVar8,&local_d0);
      lVar4 = lVar4 + 0xc;
      local_c0 = puVar8 + 1;
    } while (lVar4 != 0x188);
    break;
  case 4:
    lVar4 = 0;
    do {
      puVar2 = local_c0;
      uhugeint_t::uhugeint_t(&local_d0,(ulong)*(uint *)((long)in + lVar4));
      puVar8 = (uhugeint_t *)((long)&puVar2->lower + lVar4);
      puVar1 = (uint64_t *)((long)&puVar2->lower + lVar4);
      *puVar1 = local_d0.lower;
      puVar1[1] = local_d0.upper;
      uhugeint_t::uhugeint_t(&local_80,(ulong)*(uint *)((long)in + lVar4 + 4));
      uhugeint_t::uhugeint_t(&local_90,0x20);
      local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
      uhugeint_t::operator|=(puVar8,&local_d0);
      uhugeint_t::uhugeint_t(&local_80,(ulong)*(uint *)((long)in + lVar4 + 8));
      uhugeint_t::uhugeint_t(&local_90,0x40);
      local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
      uhugeint_t::operator|=(puVar8,&local_d0);
      uhugeint_t::uhugeint_t(&local_80,(ulong)*(uint *)((long)in + lVar4 + 0xc));
      uhugeint_t::uhugeint_t(&local_90,0x60);
      local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
      uhugeint_t::operator|=(puVar8,&local_d0);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x200);
    break;
  default:
    value = (uint64_t)width;
    lVar10 = 0;
    lVar4 = 0;
    local_b0 = in;
    local_a0 = value;
    do {
      puVar3 = local_b0;
      uVar9 = (uint)lVar10;
      uVar11 = uVar9 & 0x1f;
      uVar7 = (int)value + uVar11;
      local_b8 = lVar4;
      if (uVar7 < 0x20) {
        uhugeint_t::uhugeint_t(&local_80,(ulong)*local_b0);
        uhugeint_t::uhugeint_t(&local_90,(ulong)(uVar9 & 0x1f));
        local_d0 = uhugeint_t::operator>>(&local_80,&local_90);
        uhugeint_t::uhugeint_t(&local_40,1);
        uhugeint_t::uhugeint_t(&local_50,value);
        local_60 = uhugeint_t::operator<<(&local_40,&local_50);
        uVar12 = uhugeint_t::operator%(&local_d0,&local_60);
        *(uint64_t *)((long)&local_c0->lower + local_b8) = uVar12.lower;
        *(uint64_t *)((long)&local_c0->upper + local_b8) = uVar12.upper;
      }
      else {
        local_70 = (uhugeint_t *)((long)&local_c0->lower + lVar4);
        local_a4 = uVar7;
        if (uVar7 < 0x40) {
          uhugeint_t::uhugeint_t(&local_d0,(ulong)*local_b0);
          uhugeint_t::uhugeint_t(&local_80,(ulong)(uVar9 & 0x1f));
          uVar12 = uhugeint_t::operator>>(&local_d0,&local_80);
          *(uint64_t *)((long)&local_c0->lower + local_b8) = uVar12.lower;
          *(uint64_t *)((long)&local_c0->upper + local_b8) = uVar12.upper;
          local_b0 = puVar3 + 1;
          value = local_a0;
          if (local_a4 != 0x20) {
            uhugeint_t::uhugeint_t(&local_80,(ulong)(~(-1 << ((byte)local_a4 & 0x1f)) & *local_b0));
            uhugeint_t::uhugeint_t(&local_90,(ulong)(0x20 - uVar11));
            local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
            uhugeint_t::operator|=(local_70,&local_d0);
            value = local_a0;
          }
        }
        else if (uVar7 < 0x60) {
          uhugeint_t::uhugeint_t(&local_d0,(ulong)*local_b0);
          uhugeint_t::uhugeint_t(&local_80,(ulong)(uVar9 & 0x1f));
          uVar12 = uhugeint_t::operator>>(&local_d0,&local_80);
          puVar8 = local_70;
          *(uint64_t *)((long)&local_c0->lower + lVar4) = uVar12.lower;
          *(uint64_t *)((long)&local_c0->upper + lVar4) = uVar12.upper;
          uhugeint_t::uhugeint_t(&local_80,(ulong)puVar3[1]);
          uhugeint_t::uhugeint_t(&local_90,(ulong)(0x20 - uVar11));
          local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
          uhugeint_t::operator|=(puVar8,&local_d0);
          local_b0 = puVar3 + 2;
          value = local_a0;
          if (local_a4 != 0x40) {
            uhugeint_t::uhugeint_t(&local_80,(ulong)(~(-1 << ((byte)local_a4 & 0x1f)) & *local_b0));
            uhugeint_t::uhugeint_t(&local_90,(ulong)(0x40 - uVar11));
            local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
LAB_00578355:
            uhugeint_t::operator|=(puVar8,&local_d0);
            value = local_a0;
          }
        }
        else {
          local_68 = (ulong)(0x20 - uVar11);
          if (uVar7 < 0x80) {
            uhugeint_t::uhugeint_t(&local_d0,(ulong)*local_b0);
            uhugeint_t::uhugeint_t(&local_80,(ulong)(uVar9 & 0x1f));
            uVar12 = uhugeint_t::operator>>(&local_d0,&local_80);
            *(uint64_t *)((long)&local_c0->lower + local_b8) = uVar12.lower;
            *(uint64_t *)((long)&local_c0->upper + local_b8) = uVar12.upper;
            uhugeint_t::uhugeint_t(&local_80,(ulong)puVar3[1]);
            uhugeint_t::uhugeint_t(&local_90,local_68);
            local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
            puVar8 = local_70;
            uhugeint_t::operator|=(local_70,&local_d0);
            uhugeint_t::uhugeint_t(&local_80,(ulong)puVar3[2]);
            uhugeint_t::uhugeint_t(&local_90,(ulong)(0x40 - uVar11));
            local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
            uhugeint_t::operator|=(puVar8,&local_d0);
            local_b0 = puVar3 + 3;
            value = local_a0;
            if (local_a4 != 0x60) {
              uhugeint_t::uhugeint_t
                        (&local_80,(ulong)(~(-1 << ((byte)local_a4 & 0x1f)) & *local_b0));
              uhugeint_t::uhugeint_t(&local_90,(ulong)(0x60 - uVar11));
              local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
              uhugeint_t::operator|=(puVar8,&local_d0);
              value = local_a0;
            }
          }
          else {
            uhugeint_t::uhugeint_t(&local_d0,(ulong)*local_b0);
            uhugeint_t::uhugeint_t(&local_80,(ulong)(uVar9 & 0x1f));
            uVar12 = uhugeint_t::operator>>(&local_d0,&local_80);
            *(uint64_t *)((long)&local_c0->lower + local_b8) = uVar12.lower;
            *(uint64_t *)((long)&local_c0->upper + local_b8) = uVar12.upper;
            uhugeint_t::uhugeint_t(&local_80,(ulong)puVar3[1]);
            uhugeint_t::uhugeint_t(&local_90,local_68);
            local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
            puVar8 = local_70;
            uhugeint_t::operator|=(local_70,&local_d0);
            uhugeint_t::uhugeint_t(&local_80,(ulong)puVar3[2]);
            uhugeint_t::uhugeint_t(&local_90,(ulong)(0x40 - uVar11));
            local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
            uhugeint_t::operator|=(puVar8,&local_d0);
            uhugeint_t::uhugeint_t(&local_80,(ulong)puVar3[3]);
            uhugeint_t::uhugeint_t(&local_90,(ulong)(0x60 - uVar11));
            local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
            uhugeint_t::operator|=(puVar8,&local_d0);
            local_b0 = puVar3 + 4;
            value = local_a0;
            if (local_a4 != 0x80) {
              uhugeint_t::uhugeint_t
                        (&local_80,(ulong)(~(-1 << ((byte)local_a4 & 0x1f)) & *local_b0));
              uhugeint_t::uhugeint_t(&local_90,(ulong)(0x80 - uVar11));
              local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
              goto LAB_00578355;
            }
          }
        }
      }
      uVar7 = local_94;
      puVar3 = local_b0;
      lVar4 = local_b8 + 0x10;
      lVar10 = lVar10 + value;
    } while (lVar4 != 0x1f0);
    bVar6 = (byte)local_94;
    bVar5 = -bVar6;
    uhugeint_t::uhugeint_t(&local_d0,(ulong)(*local_b0 >> (bVar5 & 0x1f)));
    local_c0[0x1f].lower = local_d0.lower;
    local_c0[0x1f].upper = local_d0.upper;
    puVar8 = local_c0 + 0x1f;
    uVar9 = (uint)(bVar5 & 0x1f);
    if (0x20 < bVar6) {
      uhugeint_t::uhugeint_t(&local_80,(ulong)puVar3[1]);
      uhugeint_t::uhugeint_t(&local_90,(ulong)(0x20 - uVar9));
      uVar7 = local_94;
      local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
      uhugeint_t::operator|=(puVar8,&local_d0);
    }
    bVar5 = (byte)uVar7;
    if (0x40 < bVar5) {
      uhugeint_t::uhugeint_t(&local_80,(ulong)puVar3[2]);
      uhugeint_t::uhugeint_t(&local_90,(ulong)(0x40 - uVar9));
      bVar5 = (byte)local_94;
      local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
      uhugeint_t::operator|=(puVar8,&local_d0);
    }
    if (0x60 < bVar5) {
      uhugeint_t::uhugeint_t(&local_80,(ulong)puVar3[3]);
      uhugeint_t::uhugeint_t(&local_90,(ulong)(0x60 - uVar9));
      local_d0 = uhugeint_t::operator<<(&local_80,&local_90);
      uhugeint_t::operator|=(puVar8,&local_d0);
    }
  }
  return;
}

Assistant:

void HugeIntPacker::Unpack(const uint32_t *__restrict in, uhugeint_t *__restrict out, bitpacking_width_t width) {
	D_ASSERT(width <= 128);
	switch (width) {
	case 0:
		UnpackDelta0(in, out);
		break;
	case 32:
		UnpackDelta32(in, out);
		break;
	case 64:
		UnpackDelta64(in, out);
		break;
	case 96:
		UnpackDelta96(in, out);
		break;
	case 128:
		UnpackDelta128(in, out);
		break;
	default:
		for (idx_t oindex = 0; oindex < BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - 1; ++oindex) {
			UnpackSingle(in, out + oindex, width,
			             (width * oindex) % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
		}
		UnpackLast(in, out, width);
	}
}